

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_vector.cpp
# Opt level: O0

void use_stl_vector(void)

{
  ostream *poVar1;
  reference pvVar2;
  reference pvVar3;
  int local_60;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_59;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  titles;
  allocator<int> local_29;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> ratings;
  int NUM;
  
  ratings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 5;
  std::allocator<int>::allocator(&local_29);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,5,&local_29);
  std::allocator<int>::~allocator(&local_29);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_59);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i,5,&local_59);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_59);
  poVar1 = std::operator<<((ostream *)&std::cout,"Do the following:\nEnter ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,5);
  std::operator<<(poVar1," book titles and your ratings(0-10).\n");
  for (local_60 = 0; local_60 < 5; local_60 = local_60 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Enter title #");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60 + 1);
    std::operator<<(poVar1,":\n");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,(long)local_60);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)pvVar2);
    std::operator<<((ostream *)&std::cout,"Enter your ratings (0-10):\n");
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,(long)local_60);
    std::istream::operator>>(&std::cin,pvVar3);
    std::istream::get();
  }
  std::operator<<((ostream *)&std::cout,"Done. You entered the following:\n");
  std::operator<<((ostream *)&std::cout,"Rating\tBook\n");
  for (local_60 = 0; local_60 < 5; local_60 = local_60 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,(long)local_60);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar3);
    poVar1 = std::operator<<(poVar1,"\t");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,(long)local_60);
    poVar1 = std::operator<<(poVar1,(string *)pvVar2);
    std::operator<<(poVar1,"\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

void use_stl_vector () {
    using std::vector;
    using std::cout;
    using std::cin;
    using std::string;

    const int NUM = 5;

    //  similar like typescript: var arr: Array<number>;
    vector<int> ratings(NUM);
    vector<string> titles(NUM);

    cout << "Do the following:\nEnter " << NUM << " book titles and your ratings(0-10).\n";

    int i;
    for(i = 0; i < NUM; i++) {
        cout << "Enter title #" << i + 1 << ":\n";
        getline(cin, titles[i]);
        cout << "Enter your ratings (0-10):\n";
        cin >> ratings[i];
        cin.get();
    }

    cout << "Done. You entered the following:\n";
    cout << "Rating\tBook\n";
    for(i = 0; i < NUM; i++) {
        cout << ratings[i] << "\t" << titles[i] << "\n";
    }
}